

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O2

int affixMain(int argc,char **argv)

{
  char *name;
  int iVar1;
  bool_t bVar2;
  u32 uVar3;
  err_t eVar4;
  size_t in_RAX;
  size_t sVar5;
  size_t sVar6;
  octet *prefix;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  char **ppcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  size_t local_38;
  
  local_38 = in_RAX;
  if (argc < 2) {
    pcVar10 = 
    "bee2cmd/%s: %s\nUsage:\n  affix prepend <file> <prefix>\n    prepend <prefix> to <file>\n  affix append <file> <suffix>\n    append <suffix> to <file>\n  affix behead <file>\n    delete prefix of <file>\n  affix drop <file>\n    delete suffix of <file>\n  affix extr {-p<n>|-s<n>} <file> <affix>\n    extract object from <file> and store it in <affix>\n      -p<nnn> -- <n>th prefix\n      -s<nnn> -- <n>th suffix\n      \\remark p0 goes first, s0 goes last\n  affix print [field] <file>\n    print <file> info: full info or a specific field\n      full info: lengths and total number of prefixes / suffixes\n      field: {-pc|-sc}\n        -pc -- number of prefixes\n        -sc -- number of suffixes\n"
    ;
    pcVar7 = "file prefixes and suffixes";
    goto LAB_00102736;
  }
  iVar1 = strCmp(argv[1],"prepend");
  if (iVar1 == 0) {
    eVar4 = 0x25b;
    if (argc == 4) {
      eVar4 = cmdFileValExist(2,argv + 2);
      if ((eVar4 == 0) &&
         (eVar4 = cmdFilePrefixRead((octet *)0x0,&local_38,argv[3],0), sVar5 = local_38, eVar4 == 0)
         ) {
        sVar6 = cmdFileSize(argv[3]);
        eVar4 = 0x132;
        if (sVar5 == sVar6) {
          prefix = (octet *)blobCreate(local_38);
          if (prefix == (octet *)0x0) goto LAB_00102aae;
          eVar4 = cmdFilePrefixRead(prefix,&local_38,argv[3],0);
          if (eVar4 == 0) {
            eVar4 = cmdFilePrepend(argv[2],prefix,local_38);
          }
LAB_00102692:
          blobClose(prefix);
        }
      }
    }
LAB_0010271a:
    if (eVar4 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = strCmp(argv[1],"append");
    if (iVar1 == 0) {
      eVar4 = 0x25b;
      if (argc == 4) {
        eVar4 = cmdFileValExist(2,argv + 2);
        if ((eVar4 == 0) &&
           (eVar4 = cmdFileSuffixRead((octet *)0x0,&local_38,argv[3],0), sVar5 = local_38,
           eVar4 == 0)) {
          sVar6 = cmdFileSize(argv[3]);
          eVar4 = 0x132;
          if (sVar5 == sVar6) {
            prefix = (octet *)blobCreate(local_38);
            if (prefix != (octet *)0x0) {
              eVar4 = cmdFileSuffixRead(prefix,&local_38,argv[3],0);
              if (eVar4 == 0) {
                eVar4 = cmdFileAppend(argv[2],prefix,local_38);
              }
              goto LAB_00102692;
            }
LAB_00102aae:
            eVar4 = 0x6e;
          }
        }
      }
      goto LAB_0010271a;
    }
    iVar1 = strCmp(argv[1],"behead");
    if (iVar1 == 0) {
      eVar4 = 0x25b;
      if (argc == 3) {
        ppcVar11 = argv + 2;
        eVar4 = cmdFileValExist(1,ppcVar11);
        if ((eVar4 == 0) &&
           (eVar4 = cmdFilePrefixRead((octet *)0x0,&local_38,*ppcVar11,0), eVar4 == 0)) {
          eVar4 = cmdFileBehead(*ppcVar11,local_38);
        }
      }
      goto LAB_0010271a;
    }
    iVar1 = strCmp(argv[1],"drop");
    if (iVar1 == 0) {
      eVar4 = 0x25b;
      if (argc == 3) {
        ppcVar11 = argv + 2;
        eVar4 = cmdFileValExist(1,ppcVar11);
        if ((eVar4 == 0) &&
           (eVar4 = cmdFileSuffixRead((octet *)0x0,&local_38,*ppcVar11,0), eVar4 == 0)) {
          eVar4 = cmdFileDrop(*ppcVar11,local_38);
        }
      }
      goto LAB_0010271a;
    }
    iVar1 = strCmp(argv[1],"extr");
    if (iVar1 == 0) {
      eVar4 = 0x25b;
      if (argc == 5) {
        pcVar7 = argv[2];
        sVar5 = strLen(pcVar7);
        if ((sVar5 != 0) && (*pcVar7 == '-')) {
          eVar4 = cmdFileValExist(1,argv + 3);
          if (eVar4 == 0) {
            eVar4 = cmdFileValNotExist(1,argv + 4);
            if (eVar4 == 0) {
              pcVar10 = pcVar7 + 1;
              pcVar12 = argv[4];
              name = argv[3];
              bVar2 = strStartsWith(pcVar10,"p");
              if ((bVar2 == 0) && (bVar2 = strStartsWith(pcVar10,"s"), bVar2 == 0)) {
                eVar4 = 0x25b;
              }
              else {
                pcVar7 = pcVar7 + 2;
                bVar2 = decIsValid(pcVar7);
                eVar4 = 0x25b;
                if (bVar2 != 0) {
                  sVar5 = strLen(pcVar7);
                  sVar6 = decCLZ(pcVar7);
                  if (sVar5 - sVar6 < 10) {
                    uVar3 = decToU32(pcVar7);
                    bVar2 = strStartsWith(pcVar10,"p");
                    local_38 = 0;
                    lVar9 = (ulong)uVar3 + 2;
                    sVar5 = 0;
                    if (bVar2 == 0) {
                      do {
                        lVar9 = lVar9 + -1;
                        if (lVar9 == 0) {
                          prefix = (octet *)blobCreate(local_38);
                          if (prefix == (octet *)0x0) goto LAB_00102aae;
                          eVar4 = cmdFileSuffixRead(prefix,&local_38,name,sVar5);
                          goto LAB_00102a92;
                        }
                        sVar5 = sVar5 + local_38;
                        eVar4 = cmdFileSuffixRead((octet *)0x0,&local_38,name,sVar5);
                      } while (eVar4 == 0);
                    }
                    else {
                      do {
                        lVar9 = lVar9 + -1;
                        if (lVar9 == 0) {
                          prefix = (octet *)blobCreate(local_38);
                          if (prefix != (octet *)0x0) {
                            eVar4 = cmdFilePrefixRead(prefix,&local_38,name,sVar5);
LAB_00102a92:
                            if (eVar4 == 0) {
                              eVar4 = cmdFileWrite(pcVar12,prefix,local_38);
                            }
                            goto LAB_00102692;
                          }
                          goto LAB_00102aae;
                        }
                        sVar5 = sVar5 + local_38;
                        eVar4 = cmdFilePrefixRead((octet *)0x0,&local_38,name,sVar5);
                      } while (eVar4 == 0);
                    }
                  }
                }
              }
              goto LAB_0010271a;
            }
          }
        }
      }
    }
    else {
      iVar1 = strCmp(argv[1],"print");
      eVar4 = 0x259;
      if ((iVar1 == 0) && (eVar4 = 0x25b, 0xfffffffd < argc - 5U)) {
        ppcVar11 = argv + 2;
        if (argc == 4) {
          pcVar7 = *ppcVar11;
          sVar5 = strLen(pcVar7);
          if ((sVar5 == 0) || (*pcVar7 != '-')) goto LAB_0010271e;
          pcVar7 = pcVar7 + 1;
          ppcVar11 = argv + 3;
        }
        else {
          pcVar7 = (char *)0x0;
        }
        eVar4 = cmdFileValExist(1,ppcVar11);
        if (eVar4 == 0) {
          pcVar10 = *ppcVar11;
          if (pcVar7 == (char *)0x0) {
            puts("prefixes");
            sVar5 = 0;
            uVar14 = 0;
            while (eVar4 = cmdFilePrefixRead((octet *)0x0,&local_38,pcVar10,sVar5), eVar4 == 0) {
              pcVar7 = "+%u";
              if (uVar14 == 0) {
                pcVar7 = "  length: %u";
              }
              printf(pcVar7,local_38 & 0xffffffff);
              sVar5 = sVar5 + local_38;
              uVar14 = uVar14 + 1;
            }
            pcVar12 = "\n  count:  %u\n";
            pcVar7 = "\n  count:  %u\n";
            if (uVar14 == 0) {
              pcVar7 = "  count:  %u\n";
            }
            printf(pcVar7,uVar14 & 0xffffffff);
            puts("suffixes");
            sVar5 = 0;
            uVar13 = 0;
            while (eVar4 = cmdFileSuffixRead((octet *)0x0,&local_38,pcVar10,sVar5), eVar4 == 0) {
              pcVar7 = "+%u";
              if (uVar13 == 0) {
                pcVar7 = "  length: %u";
              }
              printf(pcVar7,local_38 & 0xffffffff);
              sVar5 = sVar5 + local_38;
              uVar13 = uVar13 + 1;
            }
            if (uVar13 == 0) {
              pcVar12 = "  count:  %u\n";
            }
            eVar4 = 0;
            printf(pcVar12,uVar13 & 0xffffffff);
            if (uVar14 != 0 || uVar13 != 0) {
              puts("\\warning false positives are possible");
            }
          }
          else {
            iVar1 = strCmp(pcVar7,"pc");
            if (iVar1 == 0) {
              sVar5 = 0;
              uVar8 = 0;
              while (eVar4 = cmdFilePrefixRead((octet *)0x0,&local_38,pcVar10,sVar5), eVar4 == 0) {
                sVar5 = sVar5 + local_38;
                uVar8 = uVar8 + 1;
              }
            }
            else {
              iVar1 = strCmp(pcVar7,"sc");
              eVar4 = 0x25b;
              if (iVar1 != 0) goto LAB_0010271a;
              sVar5 = 0;
              uVar8 = 0;
              while (eVar4 = cmdFileSuffixRead((octet *)0x0,&local_38,pcVar10,sVar5), eVar4 == 0) {
                sVar5 = sVar5 + local_38;
                uVar8 = uVar8 + 1;
              }
            }
            eVar4 = 0;
            printf("%u\n",(ulong)uVar8);
          }
          goto LAB_0010271a;
        }
      }
    }
  }
LAB_0010271e:
  pcVar7 = errMsg(eVar4);
  pcVar10 = "bee2cmd/%s: %s\n";
LAB_00102736:
  printf(pcVar10,"affix",pcVar7);
  return -1;
}

Assistant:

int affixMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return affixUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "prepend"))
		code = affixPrepend(argc - 1, argv + 1);
	else if (strEq(argv[0], "append"))
		code = affixAppend(argc - 1, argv + 1);
	else if (strEq(argv[0], "behead"))
		code = affixBehead(argc - 1, argv + 1);
	else if (strEq(argv[0], "drop"))
		code = affixDrop(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = affixExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = affixPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}